

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright3(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *vec,int *ridx,int *rn,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec2,int *ridx2,int *rn2,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec3,int *ridx3,int *rn3,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps3)

{
  uint *puVar1;
  undefined1 uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  fpclass_type fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  cpp_dec_float<50U,_int,_void> *pcVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  cpp_dec_float<50U,_int,_void> *pcVar15;
  int iVar16;
  ulong uVar17;
  int *piVar18;
  fpclass_type fVar19;
  int32_t iVar20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_10;
  cpp_dec_float<50U,_int,_void> local_878;
  ulong local_840;
  cpp_dec_float<50U,_int,_void> local_838;
  int *local_800;
  cpp_dec_float<50U,_int,_void> local_7f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7b8;
  int local_7ac;
  cpp_dec_float<50U,_int,_void> local_7a8;
  ulong local_770;
  int *local_768;
  int *local_760;
  int *local_758;
  pointer local_750;
  ulong local_748;
  ulong local_740;
  int *local_738;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_730;
  cpp_dec_float<50U,_int,_void> local_728;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6f0;
  cpp_dec_float<50U,_int,_void> local_6e8;
  cpp_dec_float<50U,_int,_void> local_6a8;
  cpp_dec_float<50U,_int,_void> local_668;
  cpp_dec_float<50U,_int,_void> local_628;
  cpp_dec_float<50U,_int,_void> local_5e8;
  cpp_dec_float<50U,_int,_void> local_5a8;
  cpp_dec_float<50U,_int,_void> local_568;
  cpp_dec_float<50U,_int,_void> local_528;
  cpp_dec_float<50U,_int,_void> local_4e8;
  cpp_dec_float<50U,_int,_void> local_4a8;
  cpp_dec_float<50U,_int,_void> local_468;
  cpp_dec_float<50U,_int,_void> local_428;
  cpp_dec_float<50U,_int,_void> local_3e8;
  cpp_dec_float<50U,_int,_void> local_3a8;
  cpp_dec_float<50U,_int,_void> local_368;
  cpp_dec_float<50U,_int,_void> local_328;
  cpp_dec_float<50U,_int,_void> local_2e8;
  cpp_dec_float<50U,_int,_void> local_2a8;
  cpp_dec_float<50U,_int,_void> local_268;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_7a8.fpclass = cpp_dec_float_finite;
  local_7a8.prec_elem = 10;
  local_7a8.data._M_elems[0] = 0;
  local_7a8.data._M_elems[1] = 0;
  local_7a8.data._M_elems[2] = 0;
  local_7a8.data._M_elems[3] = 0;
  local_7a8.data._M_elems[4] = 0;
  local_7a8.data._M_elems[5] = 0;
  local_7a8.data._M_elems._24_5_ = 0;
  local_7a8.data._M_elems[7]._1_3_ = 0;
  local_7a8.data._M_elems[8] = 0;
  local_7a8.data._M_elems[9] = 0;
  local_7a8.exp = 0;
  local_7a8.neg = false;
  local_7f8.fpclass = cpp_dec_float_finite;
  local_7f8.prec_elem = 10;
  local_7f8.data._M_elems[0] = 0;
  local_7f8.data._M_elems[1] = 0;
  local_7f8.data._M_elems[2] = 0;
  local_7f8.data._M_elems[3] = 0;
  local_7f8.data._M_elems[4] = 0;
  local_7f8.data._M_elems[5] = 0;
  local_7f8.data._M_elems._24_5_ = 0;
  local_7f8.data._M_elems[7]._1_3_ = 0;
  local_7f8.data._M_elems[8] = 0;
  local_7f8.data._M_elems[9] = 0;
  local_7f8.exp = 0;
  local_7f8.neg = false;
  local_838.fpclass = cpp_dec_float_finite;
  local_838.prec_elem = 10;
  local_838.data._M_elems[0] = 0;
  local_838.data._M_elems[1] = 0;
  local_838.data._M_elems[2] = 0;
  local_838.data._M_elems[3] = 0;
  local_838.data._M_elems[4] = 0;
  local_838.data._M_elems[5] = 0;
  local_838.data._M_elems._24_5_ = 0;
  local_838.data._M_elems[7]._1_3_ = 0;
  local_838.data._M_elems[8] = 0;
  local_838.data._M_elems[9] = 0;
  local_838.exp = 0;
  local_838.neg = false;
  local_750 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_758 = (this->l).idx;
  local_738 = (this->l).row;
  local_800 = (this->l).start;
  local_748 = (ulong)(this->l).firstUpdate;
  local_7c0 = vec;
  local_7b8 = vec2;
  local_768 = ridx;
  local_760 = rn;
  local_730 = eps;
  if ((long)local_748 < 1) {
    local_748 = 0;
  }
  else {
    uVar17 = 0;
    local_6f0 = this;
    do {
      iVar10 = local_738[uVar17];
      local_7a8.data._M_elems._32_8_ =
           *(undefined8 *)(local_7c0[iVar10].m_backend.data._M_elems + 8);
      local_7a8.data._M_elems._0_8_ = *(undefined8 *)local_7c0[iVar10].m_backend.data._M_elems;
      local_7a8.data._M_elems._8_8_ = *(undefined8 *)(local_7c0[iVar10].m_backend.data._M_elems + 2)
      ;
      puVar1 = local_7c0[iVar10].m_backend.data._M_elems + 4;
      local_7a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_7a8.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_7a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_878.exp = local_7c0[iVar10].m_backend.exp;
      local_7a8.neg = local_7c0[iVar10].m_backend.neg;
      local_7a8.fpclass = local_7c0[iVar10].m_backend.fpclass;
      local_7a8.prec_elem = local_7c0[iVar10].m_backend.prec_elem;
      local_7f8.data._M_elems._0_8_ = *(undefined8 *)local_7b8[iVar10].m_backend.data._M_elems;
      local_7f8.data._M_elems._8_8_ = *(undefined8 *)(local_7b8[iVar10].m_backend.data._M_elems + 2)
      ;
      puVar1 = local_7b8[iVar10].m_backend.data._M_elems + 4;
      local_7f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_7f8.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_7f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_7f8.data._M_elems._32_8_ =
           *(undefined8 *)(local_7b8[iVar10].m_backend.data._M_elems + 8);
      local_7f8.exp = local_7b8[iVar10].m_backend.exp;
      local_7f8.neg = local_7b8[iVar10].m_backend.neg;
      local_7f8.fpclass = local_7b8[iVar10].m_backend.fpclass;
      local_7f8.prec_elem = local_7b8[iVar10].m_backend.prec_elem;
      local_838.data._M_elems._0_8_ = *(undefined8 *)vec3[iVar10].m_backend.data._M_elems;
      local_838.data._M_elems._8_8_ = *(undefined8 *)(vec3[iVar10].m_backend.data._M_elems + 2);
      puVar1 = vec3[iVar10].m_backend.data._M_elems + 4;
      local_838.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_838.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_838.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_838.data._M_elems._32_8_ = *(undefined8 *)(vec3[iVar10].m_backend.data._M_elems + 8);
      local_838.exp = vec3[iVar10].m_backend.exp;
      local_838.neg = vec3[iVar10].m_backend.neg;
      local_838.fpclass = vec3[iVar10].m_backend.fpclass;
      local_838.prec_elem = vec3[iVar10].m_backend.prec_elem;
      local_878.data._M_elems._32_8_ =
           *(undefined8 *)(local_7c0[iVar10].m_backend.data._M_elems + 8);
      local_878.data._M_elems._0_8_ = *(undefined8 *)local_7c0[iVar10].m_backend.data._M_elems;
      local_878.data._M_elems._8_8_ = *(undefined8 *)(local_7c0[iVar10].m_backend.data._M_elems + 2)
      ;
      puVar1 = local_7c0[iVar10].m_backend.data._M_elems + 4;
      local_878.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_68.data._M_elems._0_8_ = *(undefined8 *)(local_730->m_backend).data._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((local_730->m_backend).data._M_elems + 2);
      local_68.data._M_elems._16_8_ = *(undefined8 *)((local_730->m_backend).data._M_elems + 4);
      local_68.data._M_elems._24_8_ = *(undefined8 *)((local_730->m_backend).data._M_elems + 6);
      local_68.data._M_elems._32_8_ = *(undefined8 *)((local_730->m_backend).data._M_elems + 8);
      local_68.exp = (local_730->m_backend).exp;
      local_68.neg = (local_730->m_backend).neg;
      local_68.fpclass = (local_730->m_backend).fpclass;
      local_68.prec_elem = (local_730->m_backend).prec_elem;
      local_878.prec_elem = local_7a8.prec_elem;
      local_878.fpclass = local_7a8.fpclass;
      local_878.neg = local_7a8.neg;
      if ((local_7a8.neg == true) &&
         (local_878.data._M_elems[0] != 0 || local_7a8.fpclass != cpp_dec_float_finite)) {
        local_878.neg = false;
      }
      local_7a8.exp = local_878.exp;
      local_770 = uVar17;
      if (local_68.fpclass == cpp_dec_float_NaN || local_7a8.fpclass == cpp_dec_float_NaN) {
        iVar10 = (eps2->m_backend).exp;
        fVar19 = (eps2->m_backend).fpclass;
        iVar20 = (eps2->m_backend).prec_elem;
        local_878.fpclass = local_7f8.fpclass;
        local_878.prec_elem = local_7f8.prec_elem;
        uVar2 = (eps2->m_backend).neg;
LAB_002b0f80:
        local_2e8.neg = (bool)uVar2;
        local_878.data._M_elems[8] = local_7f8.data._M_elems[8];
        local_878.data._M_elems[9] = local_7f8.data._M_elems[9];
        local_878.data._M_elems[4] = local_7f8.data._M_elems[4];
        local_878.data._M_elems[5] = local_7f8.data._M_elems[5];
        local_878.data._M_elems._24_5_ = local_7f8.data._M_elems._24_5_;
        local_878.data._M_elems[7]._1_3_ = local_7f8.data._M_elems[7]._1_3_;
        local_878.data._M_elems[0] = local_7f8.data._M_elems[0];
        local_878.data._M_elems[1] = local_7f8.data._M_elems[1];
        uVar4 = local_878.data._M_elems._0_8_;
        local_878.data._M_elems[2] = local_7f8.data._M_elems[2];
        local_878.data._M_elems[3] = local_7f8.data._M_elems[3];
        local_2e8.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
        local_2e8.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
        local_2e8.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
        local_2e8.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
        local_2e8.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
        local_878.neg = local_7f8.neg;
        if (((local_7f8.neg & 1U) != 0) &&
           (local_878.data._M_elems[0] = local_7f8.data._M_elems[0],
           local_878.data._M_elems[0] != 0 || local_878.fpclass != cpp_dec_float_finite)) {
          local_878.neg = (bool)(local_7f8.neg ^ 1);
        }
        local_2e8.exp = iVar10;
        local_2e8.fpclass = fVar19;
        local_2e8.prec_elem = iVar20;
        if (fVar19 == cpp_dec_float_NaN || local_878.fpclass == cpp_dec_float_NaN) {
          iVar10 = (eps3->m_backend).exp;
          fVar19 = (eps3->m_backend).fpclass;
          uVar2 = (eps3->m_backend).neg;
          iVar20 = (eps3->m_backend).prec_elem;
        }
        else {
          local_878.exp = local_7f8.exp;
          local_878.data._M_elems._0_8_ = uVar4;
          iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_878,&local_2e8);
          fVar6 = local_838.fpclass;
          iVar10 = (eps3->m_backend).exp;
          uVar2 = (eps3->m_backend).neg;
          fVar19 = (eps3->m_backend).fpclass;
          iVar20 = (eps3->m_backend).prec_elem;
          if (0 < iVar16) {
            local_840 = (ulong)local_800[uVar17];
            local_878.data._M_elems[8] = local_838.data._M_elems[8];
            local_878.data._M_elems[9] = local_838.data._M_elems[9];
            local_878.data._M_elems[4] = local_838.data._M_elems[4];
            local_878.data._M_elems[5] = local_838.data._M_elems[5];
            local_878.data._M_elems._24_5_ = local_838.data._M_elems._24_5_;
            local_878.data._M_elems[7]._1_3_ = local_838.data._M_elems[7]._1_3_;
            local_878.data._M_elems[2] = local_838.data._M_elems[2];
            local_878.data._M_elems[3] = local_838.data._M_elems[3];
            local_878.data._M_elems[0] = local_838.data._M_elems[0];
            local_878.data._M_elems[1] = local_838.data._M_elems[1];
            auVar5 = (undefined1  [16])local_878.data._M_elems._0_16_;
            local_328.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
            local_328.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
            local_328.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
            local_328.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
            local_328.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
            local_878.exp = local_838.exp;
            local_878.neg = local_838.neg;
            local_878.fpclass = local_838.fpclass;
            local_878.prec_elem = local_838.prec_elem;
            if (((local_838.neg & 1U) != 0) &&
               (local_878.data._M_elems[0] = local_838.data._M_elems[0],
               local_878.data._M_elems[0] != 0 || fVar6 != cpp_dec_float_finite)) {
              local_878.neg = (bool)(local_838.neg ^ 1);
            }
            piVar18 = local_758 + local_840;
            pcVar15 = &local_750[local_840].m_backend;
            local_878.data._M_elems._0_16_ = auVar5;
            local_328.exp = iVar10;
            local_328.neg = (bool)uVar2;
            local_328.fpclass = fVar19;
            local_328.prec_elem = iVar20;
            if ((fVar19 == cpp_dec_float_NaN || fVar6 == cpp_dec_float_NaN) ||
               (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_878,&local_328), iVar10 < 1)) {
              for (iVar10 = local_800[uVar17 + 1]; (int)local_840 < iVar10; iVar10 = iVar10 + -1) {
                iVar16 = *piVar18;
                local_6a8.fpclass = cpp_dec_float_finite;
                local_6a8.prec_elem = 10;
                local_6a8.data._M_elems[0] = 0;
                local_6a8.data._M_elems[1] = 0;
                local_6a8.data._M_elems[2] = 0;
                local_6a8.data._M_elems[3] = 0;
                local_6a8.data._M_elems[4] = 0;
                local_6a8.data._M_elems[5] = 0;
                local_6a8.data._M_elems._24_5_ = 0;
                local_6a8.data._M_elems[7]._1_3_ = 0;
                local_6a8.data._M_elems[8] = 0;
                local_6a8.data._M_elems[9] = 0;
                local_6a8.exp = 0;
                local_6a8.neg = false;
                pcVar14 = &local_7f8;
                if (pcVar15 != &local_6a8) {
                  local_6a8.data._M_elems[8] = local_7f8.data._M_elems[8];
                  local_6a8.data._M_elems[9] = local_7f8.data._M_elems[9];
                  local_6a8.data._M_elems[4] = local_7f8.data._M_elems[4];
                  local_6a8.data._M_elems[5] = local_7f8.data._M_elems[5];
                  local_6a8.data._M_elems._24_5_ = local_7f8.data._M_elems._24_5_;
                  local_6a8.data._M_elems[7]._1_3_ = local_7f8.data._M_elems[7]._1_3_;
                  local_6a8.data._M_elems[2] = local_7f8.data._M_elems[2];
                  local_6a8.data._M_elems[3] = local_7f8.data._M_elems[3];
                  local_6a8.data._M_elems[0] = local_7f8.data._M_elems[0];
                  local_6a8.data._M_elems[1] = local_7f8.data._M_elems[1];
                  local_6a8.exp = local_7f8.exp;
                  local_6a8.neg = local_7f8.neg;
                  local_6a8.fpclass = local_7f8.fpclass;
                  local_6a8.prec_elem = local_7f8.prec_elem;
                  pcVar14 = pcVar15;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_6a8,pcVar14);
                pcVar14 = &local_7b8[iVar16].m_backend;
                if (local_7b8[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                  local_878.fpclass = cpp_dec_float_finite;
                  local_878.prec_elem = 10;
                  local_878.data._M_elems[0] = 0;
                  local_878.data._M_elems[1] = 0;
                  local_878.data._M_elems[2] = 0;
                  local_878.data._M_elems[3] = 0;
                  local_878.data._M_elems[4] = 0;
                  local_878.data._M_elems[5] = 0;
                  local_878.data._M_elems._24_5_ = 0;
                  local_878.data._M_elems[7]._1_3_ = 0;
                  local_878.data._M_elems[8] = 0;
                  local_878.data._M_elems[9] = 0;
                  local_878.exp = 0;
                  local_878.neg = false;
                  pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                  local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                  local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                  uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                  local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                  local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                  local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                  local_878.exp = pcVar13->exp;
                  local_878.neg = pcVar13->neg;
                  local_878.fpclass = pcVar13->fpclass;
                  local_878.prec_elem = pcVar13->prec_elem;
                  iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar14,&local_878);
                  if (iVar12 == 0) {
                    ridx2[*rn2] = iVar16;
                    *rn2 = *rn2 + 1;
                  }
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (pcVar14,&local_6a8);
                if (pcVar14->fpclass != cpp_dec_float_NaN) {
                  local_878.fpclass = cpp_dec_float_finite;
                  local_878.prec_elem = 10;
                  local_878.data._M_elems[0] = 0;
                  local_878.data._M_elems[1] = 0;
                  local_878.data._M_elems[2] = 0;
                  local_878.data._M_elems[3] = 0;
                  local_878.data._M_elems[4] = 0;
                  local_878.data._M_elems[5] = 0;
                  local_878.data._M_elems._24_5_ = 0;
                  local_878.data._M_elems[7]._1_3_ = 0;
                  local_878.data._M_elems[8] = 0;
                  local_878.data._M_elems[9] = 0;
                  local_878.exp = 0;
                  local_878.neg = false;
                  pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                  local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                  local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                  uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                  local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                  local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                  local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                  local_878.exp = pcVar13->exp;
                  local_878.neg = pcVar13->neg;
                  local_878.fpclass = pcVar13->fpclass;
                  local_878.prec_elem = pcVar13->prec_elem;
                  iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar14,&local_878);
                  if (iVar16 == 0) {
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)pcVar14,1e-100);
                  }
                }
                piVar18 = piVar18 + 1;
                pcVar15 = pcVar15 + 1;
              }
            }
            else {
              for (iVar10 = local_800[uVar17 + 1]; (int)local_840 < iVar10; iVar10 = iVar10 + -1) {
                iVar16 = *piVar18;
                local_628.fpclass = cpp_dec_float_finite;
                local_628.prec_elem = 10;
                local_628.data._M_elems[0] = 0;
                local_628.data._M_elems[1] = 0;
                local_628.data._M_elems[2] = 0;
                local_628.data._M_elems[3] = 0;
                local_628.data._M_elems[4] = 0;
                local_628.data._M_elems[5] = 0;
                local_628.data._M_elems._24_5_ = 0;
                local_628.data._M_elems[7]._1_3_ = 0;
                local_628.data._M_elems[8] = 0;
                local_628.data._M_elems[9] = 0;
                local_628.exp = 0;
                local_628.neg = false;
                pcVar14 = &local_7f8;
                if (pcVar15 != &local_628) {
                  local_628.data._M_elems[8] = local_7f8.data._M_elems[8];
                  local_628.data._M_elems[9] = local_7f8.data._M_elems[9];
                  local_628.data._M_elems[4] = local_7f8.data._M_elems[4];
                  local_628.data._M_elems[5] = local_7f8.data._M_elems[5];
                  local_628.data._M_elems._24_5_ = local_7f8.data._M_elems._24_5_;
                  local_628.data._M_elems[7]._1_3_ = local_7f8.data._M_elems[7]._1_3_;
                  local_628.data._M_elems[2] = local_7f8.data._M_elems[2];
                  local_628.data._M_elems[3] = local_7f8.data._M_elems[3];
                  local_628.data._M_elems[0] = local_7f8.data._M_elems[0];
                  local_628.data._M_elems[1] = local_7f8.data._M_elems[1];
                  local_628.exp = local_7f8.exp;
                  local_628.neg = local_7f8.neg;
                  local_628.fpclass = local_7f8.fpclass;
                  local_628.prec_elem = local_7f8.prec_elem;
                  pcVar14 = pcVar15;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_628,pcVar14);
                pcVar14 = &local_7b8[iVar16].m_backend;
                if (local_7b8[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                  local_878.fpclass = cpp_dec_float_finite;
                  local_878.prec_elem = 10;
                  local_878.data._M_elems[0] = 0;
                  local_878.data._M_elems[1] = 0;
                  local_878.data._M_elems[2] = 0;
                  local_878.data._M_elems[3] = 0;
                  local_878.data._M_elems[4] = 0;
                  local_878.data._M_elems[5] = 0;
                  local_878.data._M_elems._24_5_ = 0;
                  local_878.data._M_elems[7]._1_3_ = 0;
                  local_878.data._M_elems[8] = 0;
                  local_878.data._M_elems[9] = 0;
                  local_878.exp = 0;
                  local_878.neg = false;
                  pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                  local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                  local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                  uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                  local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                  local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                  local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                  local_878.exp = pcVar13->exp;
                  local_878.neg = pcVar13->neg;
                  local_878.fpclass = pcVar13->fpclass;
                  local_878.prec_elem = pcVar13->prec_elem;
                  iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar14,&local_878);
                  if (iVar12 == 0) {
                    ridx2[*rn2] = iVar16;
                    *rn2 = *rn2 + 1;
                  }
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (pcVar14,&local_628);
                if (pcVar14->fpclass != cpp_dec_float_NaN) {
                  local_878.fpclass = cpp_dec_float_finite;
                  local_878.prec_elem = 10;
                  local_878.data._M_elems[0] = 0;
                  local_878.data._M_elems[1] = 0;
                  local_878.data._M_elems[2] = 0;
                  local_878.data._M_elems[3] = 0;
                  local_878.data._M_elems[4] = 0;
                  local_878.data._M_elems[5] = 0;
                  local_878.data._M_elems._24_5_ = 0;
                  local_878.data._M_elems[7]._1_3_ = 0;
                  local_878.data._M_elems[8] = 0;
                  local_878.data._M_elems[9] = 0;
                  local_878.exp = 0;
                  local_878.neg = false;
                  pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                  local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                  local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                  uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                  local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                  local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                  local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                  local_878.exp = pcVar13->exp;
                  local_878.neg = pcVar13->neg;
                  local_878.fpclass = pcVar13->fpclass;
                  local_878.prec_elem = pcVar13->prec_elem;
                  iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar14,&local_878);
                  if (iVar12 == 0) {
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)pcVar14,1e-100);
                  }
                }
                local_668.fpclass = cpp_dec_float_finite;
                local_668.prec_elem = 10;
                local_668.data._M_elems[0] = 0;
                local_668.data._M_elems[1] = 0;
                local_668.data._M_elems[2] = 0;
                local_668.data._M_elems[3] = 0;
                local_668.data._M_elems[4] = 0;
                local_668.data._M_elems[5] = 0;
                local_668.data._M_elems._24_5_ = 0;
                local_668.data._M_elems[7]._1_3_ = 0;
                local_668.data._M_elems[8] = 0;
                local_668.data._M_elems[9] = 0;
                local_668.exp = 0;
                local_668.neg = false;
                pcVar14 = &local_838;
                if (pcVar15 != &local_668) {
                  local_668.data._M_elems[8] = local_838.data._M_elems[8];
                  local_668.data._M_elems[9] = local_838.data._M_elems[9];
                  local_668.data._M_elems[4] = local_838.data._M_elems[4];
                  local_668.data._M_elems[5] = local_838.data._M_elems[5];
                  local_668.data._M_elems._24_5_ = local_838.data._M_elems._24_5_;
                  local_668.data._M_elems[7]._1_3_ = local_838.data._M_elems[7]._1_3_;
                  local_668.data._M_elems[2] = local_838.data._M_elems[2];
                  local_668.data._M_elems[3] = local_838.data._M_elems[3];
                  local_668.data._M_elems[0] = local_838.data._M_elems[0];
                  local_668.data._M_elems[1] = local_838.data._M_elems[1];
                  local_668.exp = local_838.exp;
                  local_668.neg = local_838.neg;
                  local_668.fpclass = local_838.fpclass;
                  local_668.prec_elem = local_838.prec_elem;
                  pcVar14 = pcVar15;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_668,pcVar14);
                pcVar14 = &vec3[iVar16].m_backend;
                if (vec3[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                  local_878.fpclass = cpp_dec_float_finite;
                  local_878.prec_elem = 10;
                  local_878.data._M_elems[0] = 0;
                  local_878.data._M_elems[1] = 0;
                  local_878.data._M_elems[2] = 0;
                  local_878.data._M_elems[3] = 0;
                  local_878.data._M_elems[4] = 0;
                  local_878.data._M_elems[5] = 0;
                  local_878.data._M_elems._24_5_ = 0;
                  local_878.data._M_elems[7]._1_3_ = 0;
                  local_878.data._M_elems[8] = 0;
                  local_878.data._M_elems[9] = 0;
                  local_878.exp = 0;
                  local_878.neg = false;
                  pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                  local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                  local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                  uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                  local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                  local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                  local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                  local_878.exp = pcVar13->exp;
                  local_878.neg = pcVar13->neg;
                  local_878.fpclass = pcVar13->fpclass;
                  local_878.prec_elem = pcVar13->prec_elem;
                  iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar14,&local_878);
                  if (iVar12 == 0) {
                    ridx3[*rn3] = iVar16;
                    *rn3 = *rn3 + 1;
                  }
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (pcVar14,&local_668);
                if (pcVar14->fpclass != cpp_dec_float_NaN) {
                  local_878.fpclass = cpp_dec_float_finite;
                  local_878.prec_elem = 10;
                  local_878.data._M_elems[0] = 0;
                  local_878.data._M_elems[1] = 0;
                  local_878.data._M_elems[2] = 0;
                  local_878.data._M_elems[3] = 0;
                  local_878.data._M_elems[4] = 0;
                  local_878.data._M_elems[5] = 0;
                  local_878.data._M_elems._24_5_ = 0;
                  local_878.data._M_elems[7]._1_3_ = 0;
                  local_878.data._M_elems[8] = 0;
                  local_878.data._M_elems[9] = 0;
                  local_878.exp = 0;
                  local_878.neg = false;
                  pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                  local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                  local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                  uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                  local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                  local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                  local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                  local_878.exp = pcVar13->exp;
                  local_878.neg = pcVar13->neg;
                  local_878.fpclass = pcVar13->fpclass;
                  local_878.prec_elem = pcVar13->prec_elem;
                  iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar14,&local_878);
                  if (iVar16 == 0) {
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)pcVar14,1e-100);
                  }
                }
                piVar18 = piVar18 + 1;
                pcVar15 = pcVar15 + 1;
              }
            }
            goto LAB_002b17f2;
          }
        }
        local_368.prec_elem = iVar20;
        local_368.neg = (bool)uVar2;
        local_878.data._M_elems[8] = local_838.data._M_elems[8];
        local_878.data._M_elems[9] = local_838.data._M_elems[9];
        local_878.data._M_elems[4] = local_838.data._M_elems[4];
        local_878.data._M_elems[5] = local_838.data._M_elems[5];
        local_878.data._M_elems._24_5_ = local_838.data._M_elems._24_5_;
        local_878.data._M_elems[7]._1_3_ = local_838.data._M_elems[7]._1_3_;
        local_878.data._M_elems[2] = local_838.data._M_elems[2];
        local_878.data._M_elems[3] = local_838.data._M_elems[3];
        local_878.data._M_elems[0] = local_838.data._M_elems[0];
        local_878.data._M_elems[1] = local_838.data._M_elems[1];
        auVar5 = (undefined1  [16])local_878.data._M_elems._0_16_;
        local_368.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
        local_368.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
        local_368.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
        local_368.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
        local_368.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
        local_878.exp = local_838.exp;
        local_878.neg = local_838.neg;
        local_878.prec_elem = local_838.prec_elem;
        local_878.fpclass = local_838.fpclass;
        if (((local_838.neg & 1U) != 0) &&
           (local_878.data._M_elems[0] = local_838.data._M_elems[0],
           local_878.data._M_elems[0] != 0 || local_838.fpclass != cpp_dec_float_finite)) {
          local_878.neg = (bool)(local_838.neg ^ 1);
        }
        local_368.exp = iVar10;
        local_368.fpclass = fVar19;
        if ((fVar19 != cpp_dec_float_NaN && local_838.fpclass != cpp_dec_float_NaN) &&
           (local_878.data._M_elems._0_16_ = auVar5,
           iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_878,&local_368), 0 < iVar10)) {
          iVar10 = local_800[local_770];
          iVar16 = local_800[local_770 + 1];
          if (iVar10 < iVar16) {
            pcVar15 = &local_750[iVar10].m_backend;
            piVar18 = local_758 + iVar10;
            do {
              iVar12 = *piVar18;
              local_6e8.fpclass = cpp_dec_float_finite;
              local_6e8.prec_elem = 10;
              local_6e8.data._M_elems[0] = 0;
              local_6e8.data._M_elems[1] = 0;
              local_6e8.data._M_elems[2] = 0;
              local_6e8.data._M_elems[3] = 0;
              local_6e8.data._M_elems[4] = 0;
              local_6e8.data._M_elems[5] = 0;
              local_6e8.data._M_elems._24_5_ = 0;
              local_6e8.data._M_elems[7]._1_3_ = 0;
              local_6e8.data._M_elems[8] = 0;
              local_6e8.data._M_elems[9] = 0;
              local_6e8.exp = 0;
              local_6e8.neg = false;
              pcVar14 = &local_838;
              if (pcVar15 != &local_6e8) {
                local_6e8.data._M_elems[8] = local_838.data._M_elems[8];
                local_6e8.data._M_elems[9] = local_838.data._M_elems[9];
                local_6e8.data._M_elems[4] = local_838.data._M_elems[4];
                local_6e8.data._M_elems[5] = local_838.data._M_elems[5];
                local_6e8.data._M_elems._24_5_ = local_838.data._M_elems._24_5_;
                local_6e8.data._M_elems[7]._1_3_ = local_838.data._M_elems[7]._1_3_;
                local_6e8.data._M_elems[2] = local_838.data._M_elems[2];
                local_6e8.data._M_elems[3] = local_838.data._M_elems[3];
                local_6e8.data._M_elems[0] = local_838.data._M_elems[0];
                local_6e8.data._M_elems[1] = local_838.data._M_elems[1];
                local_6e8.exp = local_838.exp;
                local_6e8.neg = local_838.neg;
                local_6e8.fpclass = local_838.fpclass;
                local_6e8.prec_elem = local_838.prec_elem;
                pcVar14 = pcVar15;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_6e8,pcVar14);
              pcVar14 = &vec3[iVar12].m_backend;
              if (vec3[iVar12].m_backend.fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar11 == 0) {
                  ridx3[*rn3] = iVar12;
                  *rn3 = *rn3 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (pcVar14,&local_6e8);
              if (pcVar14->fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar12 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)pcVar14,1e-100);
                }
              }
              piVar18 = piVar18 + 1;
              pcVar15 = pcVar15 + 1;
              iVar16 = iVar16 + -1;
            } while (iVar10 < iVar16);
          }
        }
      }
      else {
        iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_878,&local_68);
        fVar6 = local_7f8.fpclass;
        iVar10 = (eps2->m_backend).exp;
        uVar2 = (eps2->m_backend).neg;
        fVar19 = (eps2->m_backend).fpclass;
        iVar20 = (eps2->m_backend).prec_elem;
        local_878.fpclass = local_7f8.fpclass;
        local_878.prec_elem = local_7f8.prec_elem;
        if (iVar16 < 1) goto LAB_002b0f80;
        local_840 = (ulong)local_800[uVar17];
        local_878.data._M_elems[8] = local_7f8.data._M_elems[8];
        local_878.data._M_elems[9] = local_7f8.data._M_elems[9];
        local_878.data._M_elems[4] = local_7f8.data._M_elems[4];
        local_878.data._M_elems[5] = local_7f8.data._M_elems[5];
        local_878.data._M_elems._24_5_ = local_7f8.data._M_elems._24_5_;
        local_878.data._M_elems[7]._1_3_ = local_7f8.data._M_elems[7]._1_3_;
        local_878.data._M_elems[0] = local_7f8.data._M_elems[0];
        local_878.data._M_elems[1] = local_7f8.data._M_elems[1];
        uVar4 = local_878.data._M_elems._0_8_;
        local_878.data._M_elems[2] = local_7f8.data._M_elems[2];
        local_878.data._M_elems[3] = local_7f8.data._M_elems[3];
        local_2a8.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
        local_2a8.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
        local_2a8.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
        local_2a8.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
        local_2a8.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
        local_878.exp = local_7f8.exp;
        local_878.neg = local_7f8.neg;
        local_878.fpclass = local_7f8.fpclass;
        local_878.prec_elem = local_7f8.prec_elem;
        if (((local_7f8.neg & 1U) != 0) &&
           (local_878.data._M_elems[0] = local_7f8.data._M_elems[0],
           local_878.data._M_elems[0] != 0 || fVar6 != cpp_dec_float_finite)) {
          local_878.neg = (bool)(local_7f8.neg ^ 1);
        }
        piVar18 = local_758 + local_840;
        pcVar15 = &local_750[local_840].m_backend;
        local_2a8.exp = iVar10;
        local_2a8.neg = (bool)uVar2;
        local_2a8.fpclass = fVar19;
        local_2a8.prec_elem = iVar20;
        if ((fVar19 == cpp_dec_float_NaN || fVar6 == cpp_dec_float_NaN) ||
           (local_878.data._M_elems._0_8_ = uVar4,
           iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_878,&local_2a8), iVar10 < 1)) {
          local_878.data._M_elems[8] = local_838.data._M_elems[8];
          local_878.data._M_elems[9] = local_838.data._M_elems[9];
          local_878.data._M_elems[4] = local_838.data._M_elems[4];
          local_878.data._M_elems[5] = local_838.data._M_elems[5];
          local_878.data._M_elems._24_5_ = local_838.data._M_elems._24_5_;
          local_878.data._M_elems[7]._1_3_ = local_838.data._M_elems[7]._1_3_;
          local_878.data._M_elems[2] = local_838.data._M_elems[2];
          local_878.data._M_elems[3] = local_838.data._M_elems[3];
          local_878.data._M_elems[0] = local_838.data._M_elems[0];
          local_878.data._M_elems[1] = local_838.data._M_elems[1];
          auVar5 = (undefined1  [16])local_878.data._M_elems._0_16_;
          local_e8.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
          local_e8.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
          local_e8.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
          local_e8.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
          local_e8.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
          local_e8.exp = (eps3->m_backend).exp;
          local_e8.neg = (eps3->m_backend).neg;
          local_e8.fpclass = (eps3->m_backend).fpclass;
          local_e8.prec_elem = (eps3->m_backend).prec_elem;
          local_878.exp = local_838.exp;
          local_878.neg = local_838.neg;
          local_878.fpclass = local_838.fpclass;
          local_878.prec_elem = local_838.prec_elem;
          if ((local_838.neg == true) &&
             (local_878.data._M_elems[0] = local_838.data._M_elems[0],
             local_878.data._M_elems[0] != 0 || local_838.fpclass != cpp_dec_float_finite)) {
            local_878.neg = false;
          }
          local_878.data._M_elems._0_16_ = auVar5;
          if ((local_e8.fpclass == cpp_dec_float_NaN || local_838.fpclass == cpp_dec_float_NaN) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_878,&local_e8), iVar10 < 1)) {
            for (iVar10 = local_800[uVar17 + 1]; (int)local_840 < iVar10; iVar10 = iVar10 + -1) {
              iVar16 = *piVar18;
              local_5e8.fpclass = cpp_dec_float_finite;
              local_5e8.prec_elem = 10;
              local_5e8.data._M_elems[0] = 0;
              local_5e8.data._M_elems[1] = 0;
              local_5e8.data._M_elems[2] = 0;
              local_5e8.data._M_elems[3] = 0;
              local_5e8.data._M_elems[4] = 0;
              local_5e8.data._M_elems[5] = 0;
              local_5e8.data._M_elems._24_5_ = 0;
              local_5e8.data._M_elems[7]._1_3_ = 0;
              local_5e8.data._M_elems[8] = 0;
              local_5e8.data._M_elems[9] = 0;
              local_5e8.exp = 0;
              local_5e8.neg = false;
              pcVar14 = &local_7a8;
              if (pcVar15 != &local_5e8) {
                local_5e8.data._M_elems[8] = local_7a8.data._M_elems[8];
                local_5e8.data._M_elems[9] = local_7a8.data._M_elems[9];
                local_5e8.data._M_elems[4] = local_7a8.data._M_elems[4];
                local_5e8.data._M_elems[5] = local_7a8.data._M_elems[5];
                local_5e8.data._M_elems._24_5_ = local_7a8.data._M_elems._24_5_;
                local_5e8.data._M_elems[7]._1_3_ = local_7a8.data._M_elems[7]._1_3_;
                local_5e8.data._M_elems[2] = local_7a8.data._M_elems[2];
                local_5e8.data._M_elems[3] = local_7a8.data._M_elems[3];
                local_5e8.data._M_elems[0] = local_7a8.data._M_elems[0];
                local_5e8.data._M_elems[1] = local_7a8.data._M_elems[1];
                local_5e8.exp = local_7a8.exp;
                local_5e8.neg = local_7a8.neg;
                local_5e8.fpclass = local_7a8.fpclass;
                local_5e8.prec_elem = local_7a8.prec_elem;
                pcVar14 = pcVar15;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_5e8,pcVar14);
              pcVar14 = &local_7c0[iVar16].m_backend;
              if (local_7c0[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar12 == 0) {
                  local_768[*local_760] = iVar16;
                  *local_760 = *local_760 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (pcVar14,&local_5e8);
              if (pcVar14->fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar16 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)pcVar14,1e-100);
                }
              }
              piVar18 = piVar18 + 1;
              pcVar15 = pcVar15 + 1;
            }
          }
          else {
            for (iVar10 = local_800[uVar17 + 1]; (int)local_840 < iVar10; iVar10 = iVar10 + -1) {
              iVar16 = *piVar18;
              local_568.fpclass = cpp_dec_float_finite;
              local_568.prec_elem = 10;
              local_568.data._M_elems[0] = 0;
              local_568.data._M_elems[1] = 0;
              local_568.data._M_elems[2] = 0;
              local_568.data._M_elems[3] = 0;
              local_568.data._M_elems[4] = 0;
              local_568.data._M_elems[5] = 0;
              local_568.data._M_elems._24_5_ = 0;
              local_568.data._M_elems[7]._1_3_ = 0;
              local_568.data._M_elems[8] = 0;
              local_568.data._M_elems[9] = 0;
              local_568.exp = 0;
              local_568.neg = false;
              pcVar14 = &local_7a8;
              if (pcVar15 != &local_568) {
                local_568.data._M_elems[8] = local_7a8.data._M_elems[8];
                local_568.data._M_elems[9] = local_7a8.data._M_elems[9];
                local_568.data._M_elems[4] = local_7a8.data._M_elems[4];
                local_568.data._M_elems[5] = local_7a8.data._M_elems[5];
                local_568.data._M_elems._24_5_ = local_7a8.data._M_elems._24_5_;
                local_568.data._M_elems[7]._1_3_ = local_7a8.data._M_elems[7]._1_3_;
                local_568.data._M_elems[2] = local_7a8.data._M_elems[2];
                local_568.data._M_elems[3] = local_7a8.data._M_elems[3];
                local_568.data._M_elems[0] = local_7a8.data._M_elems[0];
                local_568.data._M_elems[1] = local_7a8.data._M_elems[1];
                local_568.exp = local_7a8.exp;
                local_568.neg = local_7a8.neg;
                local_568.fpclass = local_7a8.fpclass;
                local_568.prec_elem = local_7a8.prec_elem;
                pcVar14 = pcVar15;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_568,pcVar14);
              pcVar14 = &local_7c0[iVar16].m_backend;
              if (local_7c0[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar12 == 0) {
                  local_768[*local_760] = iVar16;
                  *local_760 = *local_760 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (pcVar14,&local_568);
              if (pcVar14->fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar12 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)pcVar14,1e-100);
                }
              }
              local_5a8.fpclass = cpp_dec_float_finite;
              local_5a8.prec_elem = 10;
              local_5a8.data._M_elems[0] = 0;
              local_5a8.data._M_elems[1] = 0;
              local_5a8.data._M_elems[2] = 0;
              local_5a8.data._M_elems[3] = 0;
              local_5a8.data._M_elems[4] = 0;
              local_5a8.data._M_elems[5] = 0;
              local_5a8.data._M_elems._24_5_ = 0;
              local_5a8.data._M_elems[7]._1_3_ = 0;
              local_5a8.data._M_elems[8] = 0;
              local_5a8.data._M_elems[9] = 0;
              local_5a8.exp = 0;
              local_5a8.neg = false;
              pcVar14 = &local_838;
              if (pcVar15 != &local_5a8) {
                local_5a8.data._M_elems[8] = local_838.data._M_elems[8];
                local_5a8.data._M_elems[9] = local_838.data._M_elems[9];
                local_5a8.data._M_elems[4] = local_838.data._M_elems[4];
                local_5a8.data._M_elems[5] = local_838.data._M_elems[5];
                local_5a8.data._M_elems._24_5_ = local_838.data._M_elems._24_5_;
                local_5a8.data._M_elems[7]._1_3_ = local_838.data._M_elems[7]._1_3_;
                local_5a8.data._M_elems[2] = local_838.data._M_elems[2];
                local_5a8.data._M_elems[3] = local_838.data._M_elems[3];
                local_5a8.data._M_elems[0] = local_838.data._M_elems[0];
                local_5a8.data._M_elems[1] = local_838.data._M_elems[1];
                local_5a8.exp = local_838.exp;
                local_5a8.neg = local_838.neg;
                local_5a8.fpclass = local_838.fpclass;
                local_5a8.prec_elem = local_838.prec_elem;
                pcVar14 = pcVar15;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_5a8,pcVar14);
              pcVar14 = &vec3[iVar16].m_backend;
              if (vec3[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar12 == 0) {
                  ridx3[*rn3] = iVar16;
                  *rn3 = *rn3 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (pcVar14,&local_5a8);
              if (pcVar14->fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar16 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)pcVar14,1e-100);
                }
              }
              piVar18 = piVar18 + 1;
              pcVar15 = pcVar15 + 1;
            }
          }
        }
        else {
          local_878.data._M_elems[8] = local_838.data._M_elems[8];
          local_878.data._M_elems[9] = local_838.data._M_elems[9];
          local_878.data._M_elems[4] = local_838.data._M_elems[4];
          local_878.data._M_elems[5] = local_838.data._M_elems[5];
          local_878.data._M_elems._24_5_ = local_838.data._M_elems._24_5_;
          local_878.data._M_elems[7]._1_3_ = local_838.data._M_elems[7]._1_3_;
          local_878.data._M_elems[2] = local_838.data._M_elems[2];
          local_878.data._M_elems[3] = local_838.data._M_elems[3];
          local_878.data._M_elems[0] = local_838.data._M_elems[0];
          local_878.data._M_elems[1] = local_838.data._M_elems[1];
          auVar5 = (undefined1  [16])local_878.data._M_elems._0_16_;
          local_a8.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
          local_a8.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
          local_a8.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
          local_a8.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
          local_a8.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
          local_a8.exp = (eps3->m_backend).exp;
          local_a8.neg = (eps3->m_backend).neg;
          local_a8.fpclass = (eps3->m_backend).fpclass;
          local_a8.prec_elem = (eps3->m_backend).prec_elem;
          local_878.exp = local_838.exp;
          local_878.neg = local_838.neg;
          local_878.fpclass = local_838.fpclass;
          local_878.prec_elem = local_838.prec_elem;
          if ((local_838.neg == true) &&
             (local_878.data._M_elems[0] = local_838.data._M_elems[0],
             local_878.data._M_elems[0] != 0 || local_838.fpclass != cpp_dec_float_finite)) {
            local_878.neg = false;
          }
          local_878.data._M_elems._0_16_ = auVar5;
          if ((local_a8.fpclass == cpp_dec_float_NaN || local_838.fpclass == cpp_dec_float_NaN) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_878,&local_a8), iVar10 < 1)) {
            for (iVar10 = local_800[uVar17 + 1]; (int)local_840 < iVar10; iVar10 = iVar10 + -1) {
              iVar16 = *piVar18;
              local_4e8.fpclass = cpp_dec_float_finite;
              local_4e8.prec_elem = 10;
              local_4e8.data._M_elems[0] = 0;
              local_4e8.data._M_elems[1] = 0;
              local_4e8.data._M_elems[2] = 0;
              local_4e8.data._M_elems[3] = 0;
              local_4e8.data._M_elems[4] = 0;
              local_4e8.data._M_elems[5] = 0;
              local_4e8.data._M_elems._24_5_ = 0;
              local_4e8.data._M_elems[7]._1_3_ = 0;
              local_4e8.data._M_elems[8] = 0;
              local_4e8.data._M_elems[9] = 0;
              local_4e8.exp = 0;
              local_4e8.neg = false;
              pcVar14 = &local_7a8;
              if (pcVar15 != &local_4e8) {
                local_4e8.data._M_elems[8] = local_7a8.data._M_elems[8];
                local_4e8.data._M_elems[9] = local_7a8.data._M_elems[9];
                local_4e8.data._M_elems[4] = local_7a8.data._M_elems[4];
                local_4e8.data._M_elems[5] = local_7a8.data._M_elems[5];
                local_4e8.data._M_elems._24_5_ = local_7a8.data._M_elems._24_5_;
                local_4e8.data._M_elems[7]._1_3_ = local_7a8.data._M_elems[7]._1_3_;
                local_4e8.data._M_elems[2] = local_7a8.data._M_elems[2];
                local_4e8.data._M_elems[3] = local_7a8.data._M_elems[3];
                local_4e8.data._M_elems[0] = local_7a8.data._M_elems[0];
                local_4e8.data._M_elems[1] = local_7a8.data._M_elems[1];
                local_4e8.exp = local_7a8.exp;
                local_4e8.neg = local_7a8.neg;
                local_4e8.fpclass = local_7a8.fpclass;
                local_4e8.prec_elem = local_7a8.prec_elem;
                pcVar14 = pcVar15;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_4e8,pcVar14);
              pcVar14 = &local_7c0[iVar16].m_backend;
              if (local_7c0[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar12 == 0) {
                  local_768[*local_760] = iVar16;
                  *local_760 = *local_760 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (pcVar14,&local_4e8);
              if (pcVar14->fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar12 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)pcVar14,1e-100);
                }
              }
              local_528.fpclass = cpp_dec_float_finite;
              local_528.prec_elem = 10;
              local_528.data._M_elems[0] = 0;
              local_528.data._M_elems[1] = 0;
              local_528.data._M_elems[2] = 0;
              local_528.data._M_elems[3] = 0;
              local_528.data._M_elems[4] = 0;
              local_528.data._M_elems[5] = 0;
              local_528.data._M_elems._24_5_ = 0;
              local_528.data._M_elems[7]._1_3_ = 0;
              local_528.data._M_elems[8] = 0;
              local_528.data._M_elems[9] = 0;
              local_528.exp = 0;
              local_528.neg = false;
              pcVar14 = &local_7f8;
              if (pcVar15 != &local_528) {
                local_528.data._M_elems[8] = local_7f8.data._M_elems[8];
                local_528.data._M_elems[9] = local_7f8.data._M_elems[9];
                local_528.data._M_elems[4] = local_7f8.data._M_elems[4];
                local_528.data._M_elems[5] = local_7f8.data._M_elems[5];
                local_528.data._M_elems._24_5_ = local_7f8.data._M_elems._24_5_;
                local_528.data._M_elems[7]._1_3_ = local_7f8.data._M_elems[7]._1_3_;
                local_528.data._M_elems[2] = local_7f8.data._M_elems[2];
                local_528.data._M_elems[3] = local_7f8.data._M_elems[3];
                local_528.data._M_elems[0] = local_7f8.data._M_elems[0];
                local_528.data._M_elems[1] = local_7f8.data._M_elems[1];
                local_528.exp = local_7f8.exp;
                local_528.neg = local_7f8.neg;
                local_528.fpclass = local_7f8.fpclass;
                local_528.prec_elem = local_7f8.prec_elem;
                pcVar14 = pcVar15;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_528,pcVar14);
              pcVar14 = &local_7b8[iVar16].m_backend;
              if (local_7b8[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar12 == 0) {
                  ridx2[*rn2] = iVar16;
                  *rn2 = *rn2 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (pcVar14,&local_528);
              if (pcVar14->fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar16 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)pcVar14,1e-100);
                }
              }
              piVar18 = piVar18 + 1;
              pcVar15 = pcVar15 + 1;
            }
          }
          else {
            iVar10 = local_800[uVar17 + 1];
            while ((int)local_840 < iVar10) {
              local_740 = CONCAT44(local_740._4_4_,iVar10);
              iVar10 = *piVar18;
              local_3a8.fpclass = cpp_dec_float_finite;
              local_3a8.prec_elem = 10;
              local_3a8.data._M_elems[0] = 0;
              local_3a8.data._M_elems[1] = 0;
              local_3a8.data._M_elems[2] = 0;
              local_3a8.data._M_elems[3] = 0;
              local_3a8.data._M_elems[4] = 0;
              local_3a8.data._M_elems[5] = 0;
              local_3a8.data._M_elems._24_5_ = 0;
              local_3a8.data._M_elems[7]._1_3_ = 0;
              local_3a8.data._M_elems[8] = 0;
              local_3a8.data._M_elems[9] = 0;
              local_3a8.exp = 0;
              local_3a8.neg = false;
              pcVar14 = &local_7a8;
              if (pcVar15 != &local_3a8) {
                local_3a8.data._M_elems[8] = local_7a8.data._M_elems[8];
                local_3a8.data._M_elems[9] = local_7a8.data._M_elems[9];
                local_3a8.data._M_elems[4] = local_7a8.data._M_elems[4];
                local_3a8.data._M_elems[5] = local_7a8.data._M_elems[5];
                local_3a8.data._M_elems._24_5_ = local_7a8.data._M_elems._24_5_;
                local_3a8.data._M_elems[7]._1_3_ = local_7a8.data._M_elems[7]._1_3_;
                local_3a8.data._M_elems[2] = local_7a8.data._M_elems[2];
                local_3a8.data._M_elems[3] = local_7a8.data._M_elems[3];
                local_3a8.data._M_elems[0] = local_7a8.data._M_elems[0];
                local_3a8.data._M_elems[1] = local_7a8.data._M_elems[1];
                local_3a8.exp = local_7a8.exp;
                local_3a8.neg = local_7a8.neg;
                local_3a8.fpclass = local_7a8.fpclass;
                local_3a8.prec_elem = local_7a8.prec_elem;
                pcVar14 = pcVar15;
              }
              local_7ac = iVar10;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_3a8,pcVar14);
              pcVar14 = &local_7c0[iVar10].m_backend;
              if (local_7c0[iVar10].m_backend.fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar16 == 0) {
                  local_768[*local_760] = local_7ac;
                  *local_760 = *local_760 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (pcVar14,&local_3a8);
              if (pcVar14->fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar16 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)pcVar14,1e-100);
                }
              }
              local_3e8.fpclass = cpp_dec_float_finite;
              local_3e8.prec_elem = 10;
              local_3e8.data._M_elems[0] = 0;
              local_3e8.data._M_elems[1] = 0;
              local_3e8.data._M_elems[2] = 0;
              local_3e8.data._M_elems[3] = 0;
              local_3e8.data._M_elems[4] = 0;
              local_3e8.data._M_elems[5] = 0;
              local_3e8.data._M_elems._24_5_ = 0;
              local_3e8.data._M_elems[7]._1_3_ = 0;
              local_3e8.data._M_elems[8] = 0;
              local_3e8.data._M_elems[9] = 0;
              local_3e8.exp = 0;
              local_3e8.neg = false;
              pcVar14 = &local_7f8;
              if (pcVar15 != &local_3e8) {
                local_3e8.data._M_elems[8] = local_7f8.data._M_elems[8];
                local_3e8.data._M_elems[9] = local_7f8.data._M_elems[9];
                local_3e8.data._M_elems[4] = local_7f8.data._M_elems[4];
                local_3e8.data._M_elems[5] = local_7f8.data._M_elems[5];
                local_3e8.data._M_elems._24_5_ = local_7f8.data._M_elems._24_5_;
                local_3e8.data._M_elems[7]._1_3_ = local_7f8.data._M_elems[7]._1_3_;
                local_3e8.data._M_elems[2] = local_7f8.data._M_elems[2];
                local_3e8.data._M_elems[3] = local_7f8.data._M_elems[3];
                local_3e8.data._M_elems[0] = local_7f8.data._M_elems[0];
                local_3e8.data._M_elems[1] = local_7f8.data._M_elems[1];
                local_3e8.exp = local_7f8.exp;
                local_3e8.neg = local_7f8.neg;
                local_3e8.fpclass = local_7f8.fpclass;
                local_3e8.prec_elem = local_7f8.prec_elem;
                pcVar14 = pcVar15;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_3e8,pcVar14);
              pcVar14 = &local_7b8[iVar10].m_backend;
              if (local_7b8[iVar10].m_backend.fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar16 == 0) {
                  ridx2[*rn2] = local_7ac;
                  *rn2 = *rn2 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (pcVar14,&local_3e8);
              if (pcVar14->fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar16 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)pcVar14,1e-100);
                }
              }
              local_428.fpclass = cpp_dec_float_finite;
              local_428.prec_elem = 10;
              local_428.data._M_elems[0] = 0;
              local_428.data._M_elems[1] = 0;
              local_428.data._M_elems[2] = 0;
              local_428.data._M_elems[3] = 0;
              local_428.data._M_elems[4] = 0;
              local_428.data._M_elems[5] = 0;
              local_428.data._M_elems._24_5_ = 0;
              local_428.data._M_elems[7]._1_3_ = 0;
              local_428.data._M_elems[8] = 0;
              local_428.data._M_elems[9] = 0;
              local_428.exp = 0;
              local_428.neg = false;
              pcVar14 = &local_838;
              if (pcVar15 != &local_428) {
                local_428.data._M_elems[8] = local_838.data._M_elems[8];
                local_428.data._M_elems[9] = local_838.data._M_elems[9];
                local_428.data._M_elems[4] = local_838.data._M_elems[4];
                local_428.data._M_elems[5] = local_838.data._M_elems[5];
                local_428.data._M_elems._24_5_ = local_838.data._M_elems._24_5_;
                local_428.data._M_elems[7]._1_3_ = local_838.data._M_elems[7]._1_3_;
                local_428.data._M_elems[2] = local_838.data._M_elems[2];
                local_428.data._M_elems[3] = local_838.data._M_elems[3];
                local_428.data._M_elems[0] = local_838.data._M_elems[0];
                local_428.data._M_elems[1] = local_838.data._M_elems[1];
                local_428.exp = local_838.exp;
                local_428.neg = local_838.neg;
                local_428.fpclass = local_838.fpclass;
                local_428.prec_elem = local_838.prec_elem;
                pcVar14 = pcVar15;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_428,pcVar14);
              pcVar14 = &vec3[iVar10].m_backend;
              if (vec3[iVar10].m_backend.fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar10 == 0) {
                  ridx3[*rn3] = local_7ac;
                  *rn3 = *rn3 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (pcVar14,&local_428);
              if (pcVar14->fpclass != cpp_dec_float_NaN) {
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 10;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems._24_5_ = 0;
                local_878.data._M_elems[7]._1_3_ = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.exp = 0;
                local_878.neg = false;
                pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_878.exp = pcVar13->exp;
                local_878.neg = pcVar13->neg;
                local_878.fpclass = pcVar13->fpclass;
                local_878.prec_elem = pcVar13->prec_elem;
                iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_878);
                if (iVar10 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)pcVar14,1e-100);
                }
              }
              piVar18 = piVar18 + 1;
              pcVar15 = pcVar15 + 1;
              iVar10 = (int)local_740 + -1;
            }
          }
        }
      }
LAB_002b17f2:
      uVar17 = local_770 + 1;
      this = local_6f0;
    } while (uVar17 != local_748);
  }
  if ((this->l).updateType != 0) {
    uVar3 = (this->l).firstUnused;
    local_740 = (ulong)uVar3;
    if ((int)local_748 < (int)uVar3) {
      local_840 = local_748 & 0xffffffff;
      do {
        iVar10 = local_800[local_840];
        local_728.fpclass = cpp_dec_float_finite;
        local_728.prec_elem = 10;
        local_728.data._M_elems[0] = 0;
        local_728.data._M_elems[1] = 0;
        local_728.data._M_elems[2] = 0;
        local_728.data._M_elems[3] = 0;
        local_728.data._M_elems[4] = 0;
        local_728.data._M_elems[5] = 0;
        local_728.data._M_elems._24_5_ = 0;
        local_728.data._M_elems[7]._1_3_ = 0;
        local_728.data._M_elems[8] = 0;
        local_728.data._M_elems[9] = 0;
        local_728.exp = 0;
        local_728.neg = false;
        local_468.fpclass = cpp_dec_float_finite;
        local_468.prec_elem = 10;
        local_468.data._M_elems[0] = 0;
        local_468.data._M_elems[1] = 0;
        local_468.data._M_elems[2] = 0;
        local_468.data._M_elems[3] = 0;
        local_468.data._M_elems[4] = 0;
        local_468.data._M_elems[5] = 0;
        local_468.data._M_elems._24_5_ = 0;
        local_468.data._M_elems[7]._1_3_ = 0;
        local_468.data._M_elems[8] = 0;
        local_468.data._M_elems[9] = 0;
        local_468.exp = 0;
        local_468.neg = false;
        local_4a8.fpclass = cpp_dec_float_finite;
        local_4a8.prec_elem = 10;
        local_4a8.data._M_elems[0] = 0;
        local_4a8.data._M_elems[1] = 0;
        local_4a8.data._M_elems[2] = 0;
        local_4a8.data._M_elems[3] = 0;
        local_4a8.data._M_elems[4] = 0;
        local_4a8.data._M_elems[5] = 0;
        local_4a8.data._M_elems._24_5_ = 0;
        local_4a8.data._M_elems[7]._1_3_ = 0;
        local_4a8.data._M_elems[8] = 0;
        local_4a8.data._M_elems[9] = 0;
        local_4a8.exp = 0;
        local_4a8.neg = false;
        iVar16 = local_800[local_840 + 1];
        if (iVar10 < iVar16) {
          pcVar15 = &local_750[iVar10].m_backend;
          piVar18 = local_758 + iVar10;
          do {
            pcVar13 = &local_7c0[*piVar18].m_backend;
            local_878.fpclass = cpp_dec_float_finite;
            local_878.prec_elem = 10;
            local_878.data._M_elems[0] = 0;
            local_878.data._M_elems[1] = 0;
            local_878.data._M_elems[2] = 0;
            local_878.data._M_elems[3] = 0;
            local_878.data._M_elems[4] = 0;
            local_878.data._M_elems[5] = 0;
            local_878.data._M_elems._24_5_ = 0;
            local_878.data._M_elems[7]._1_3_ = 0;
            local_878.data._M_elems[8] = 0;
            local_878.data._M_elems[9] = 0;
            local_878.exp = 0;
            local_878.neg = false;
            pcVar14 = pcVar13;
            if ((pcVar15 != &local_878) && (pcVar14 = pcVar15, &local_878 != pcVar13)) {
              local_878.data._M_elems._32_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)&pcVar13->data)->data)._M_elems + 8);
              local_878.data._M_elems._0_16_ =
                   *(undefined1 (*) [16])
                    (((cpp_dec_float<50U,_int,_void> *)&pcVar13->data)->data)._M_elems;
              local_878.data._M_elems._16_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)&pcVar13->data)->data)._M_elems + 4);
              uVar4 = *(undefined8 *)
                       ((((cpp_dec_float<50U,_int,_void> *)&pcVar13->data)->data)._M_elems + 6);
              local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_878.exp = pcVar13->exp;
              local_878.neg = pcVar13->neg;
              local_878.fpclass = pcVar13->fpclass;
              local_878.prec_elem = pcVar13->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_878,pcVar14);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_728,&local_878);
            pcVar13 = &local_7b8[*piVar18].m_backend;
            local_878.fpclass = cpp_dec_float_finite;
            local_878.prec_elem = 10;
            local_878.data._M_elems[0] = 0;
            local_878.data._M_elems[1] = 0;
            local_878.data._M_elems[2] = 0;
            local_878.data._M_elems[3] = 0;
            local_878.data._M_elems[4] = 0;
            local_878.data._M_elems[5] = 0;
            local_878.data._M_elems._24_5_ = 0;
            local_878.data._M_elems[7]._1_3_ = 0;
            local_878.data._M_elems[8] = 0;
            local_878.data._M_elems[9] = 0;
            local_878.exp = 0;
            local_878.neg = false;
            pcVar14 = pcVar13;
            if ((pcVar15 != &local_878) && (pcVar14 = pcVar15, &local_878 != pcVar13)) {
              local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
              local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
              local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
              uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
              local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_878.exp = pcVar13->exp;
              local_878.neg = pcVar13->neg;
              local_878.fpclass = pcVar13->fpclass;
              local_878.prec_elem = pcVar13->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_878,pcVar14);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_468,&local_878);
            pcVar13 = &vec3[*piVar18].m_backend;
            local_878.fpclass = cpp_dec_float_finite;
            local_878.prec_elem = 10;
            local_878.data._M_elems[0] = 0;
            local_878.data._M_elems[1] = 0;
            local_878.data._M_elems[2] = 0;
            local_878.data._M_elems[3] = 0;
            local_878.data._M_elems[4] = 0;
            local_878.data._M_elems[5] = 0;
            local_878.data._M_elems._24_5_ = 0;
            local_878.data._M_elems[7]._1_3_ = 0;
            local_878.data._M_elems[8] = 0;
            local_878.data._M_elems[9] = 0;
            local_878.exp = 0;
            local_878.neg = false;
            pcVar14 = pcVar13;
            if ((pcVar15 != &local_878) && (pcVar14 = pcVar15, &local_878 != pcVar13)) {
              local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
              local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
              local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
              uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
              local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_878.exp = pcVar13->exp;
              local_878.neg = pcVar13->neg;
              local_878.fpclass = pcVar13->fpclass;
              local_878.prec_elem = pcVar13->prec_elem;
            }
            piVar18 = piVar18 + 1;
            pcVar15 = pcVar15 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_878,pcVar14);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_4a8,&local_878);
            iVar16 = iVar16 + -1;
          } while (iVar10 < iVar16);
          fVar19 = local_468.fpclass;
          iVar20 = local_468.prec_elem;
          local_7a8.fpclass = local_728.fpclass;
          local_7a8.prec_elem = local_728.prec_elem;
        }
        else {
          local_7a8.prec_elem = 10;
          local_7a8.fpclass = cpp_dec_float_finite;
          fVar19 = cpp_dec_float_finite;
          iVar20 = 10;
        }
        auVar9 = (undefined1  [16])local_468.data._M_elems._0_16_;
        auVar8 = (undefined1  [16])local_4a8.data._M_elems._0_16_;
        auVar7 = (undefined1  [16])local_728.data._M_elems._0_16_;
        uVar17 = local_840;
        local_7a8.data._M_elems[8] = local_728.data._M_elems[8];
        local_7a8.data._M_elems[9] = local_728.data._M_elems[9];
        local_7a8.data._M_elems[4] = local_728.data._M_elems[4];
        local_7a8.data._M_elems[5] = local_728.data._M_elems[5];
        local_7a8.data._M_elems._24_5_ = local_728.data._M_elems._24_5_;
        local_7a8.data._M_elems[7]._1_3_ = local_728.data._M_elems[7]._1_3_;
        local_7a8.data._M_elems[0] = local_728.data._M_elems[0];
        local_7a8.data._M_elems[1] = local_728.data._M_elems[1];
        uVar4 = local_7a8.data._M_elems._0_8_;
        local_7a8.data._M_elems[0] = local_728.data._M_elems[0];
        local_7a8.data._M_elems[1] = local_728.data._M_elems[1];
        local_7a8.data._M_elems[2] = local_728.data._M_elems[2];
        local_7a8.data._M_elems[3] = local_728.data._M_elems[3];
        local_7f8.data._M_elems[0] = local_468.data._M_elems[0];
        local_7f8.data._M_elems[1] = local_468.data._M_elems[1];
        local_7f8.data._M_elems[2] = local_468.data._M_elems[2];
        local_7f8.data._M_elems[3] = local_468.data._M_elems[3];
        local_7f8.data._M_elems[4] = local_468.data._M_elems[4];
        local_7f8.data._M_elems[5] = local_468.data._M_elems[5];
        local_7f8.data._M_elems._24_5_ = local_468.data._M_elems._24_5_;
        local_7f8.data._M_elems[7]._1_3_ = local_468.data._M_elems[7]._1_3_;
        local_7f8.data._M_elems[8] = local_468.data._M_elems[8];
        local_7f8.data._M_elems[9] = local_468.data._M_elems[9];
        local_7f8.prec_elem = iVar20;
        local_7f8.fpclass = fVar19;
        local_838.data._M_elems[8] = local_4a8.data._M_elems[8];
        local_838.data._M_elems[9] = local_4a8.data._M_elems[9];
        local_838.data._M_elems[4] = local_4a8.data._M_elems[4];
        local_838.data._M_elems[5] = local_4a8.data._M_elems[5];
        local_838.data._M_elems._24_5_ = local_4a8.data._M_elems._24_5_;
        local_838.data._M_elems[7]._1_3_ = local_4a8.data._M_elems[7]._1_3_;
        local_838.data._M_elems[0] = local_4a8.data._M_elems[0];
        local_838.data._M_elems[1] = local_4a8.data._M_elems[1];
        local_838.data._M_elems[2] = local_4a8.data._M_elems[2];
        local_838.data._M_elems[3] = local_4a8.data._M_elems[3];
        iVar10 = local_738[local_840];
        local_878.data._M_elems[8] = local_728.data._M_elems[8];
        local_878.data._M_elems[9] = local_728.data._M_elems[9];
        local_878.data._M_elems[4] = local_728.data._M_elems[4];
        local_878.data._M_elems[5] = local_728.data._M_elems[5];
        local_878.data._M_elems._24_5_ = local_728.data._M_elems._24_5_;
        local_878.data._M_elems[7]._1_3_ = local_728.data._M_elems[7]._1_3_;
        local_728.data._M_elems[0] = auVar7._0_4_;
        local_728.data._M_elems[1] = auVar7._4_4_;
        local_728.data._M_elems[2] = auVar7._8_4_;
        local_728.data._M_elems[3] = auVar7._12_4_;
        local_878.data._M_elems[0] = local_728.data._M_elems[0];
        local_878.data._M_elems[1] = local_728.data._M_elems[1];
        local_878.data._M_elems[2] = local_728.data._M_elems[2];
        local_878.data._M_elems[3] = local_728.data._M_elems[3];
        auVar5 = (undefined1  [16])local_878.data._M_elems._0_16_;
        local_128.data._M_elems._32_8_ = *(undefined8 *)((local_730->m_backend).data._M_elems + 8);
        local_128.data._M_elems._0_8_ = *(undefined8 *)(local_730->m_backend).data._M_elems;
        local_128.data._M_elems._8_8_ = *(undefined8 *)((local_730->m_backend).data._M_elems + 2);
        local_128.data._M_elems._16_8_ = *(undefined8 *)((local_730->m_backend).data._M_elems + 4);
        local_128.data._M_elems._24_8_ = *(undefined8 *)((local_730->m_backend).data._M_elems + 6);
        local_128.exp = (local_730->m_backend).exp;
        local_128.neg = (local_730->m_backend).neg;
        local_128.fpclass = (local_730->m_backend).fpclass;
        local_128.prec_elem = (local_730->m_backend).prec_elem;
        local_878.prec_elem = local_7a8.prec_elem;
        local_878.fpclass = local_7a8.fpclass;
        local_878.neg = local_728.neg;
        if (((local_728.neg & 1U) != 0) &&
           (local_878.data._M_elems[0] = auVar7._0_4_,
           local_878.data._M_elems[0] != 0 || local_7a8.fpclass != cpp_dec_float_finite)) {
          local_878.neg = (bool)(local_728.neg ^ 1);
        }
        local_770 = CONCAT44(local_770._4_4_,iVar10);
        local_838.exp = local_4a8.exp;
        local_838.neg = local_4a8.neg;
        local_838._48_8_ = local_4a8._48_8_;
        local_7f8.exp = local_468.exp;
        local_7f8.neg = local_468.neg;
        local_7a8.exp = local_728.exp;
        local_7a8.neg = local_728.neg;
        local_728.data._M_elems._0_16_ = auVar7;
        local_4a8.data._M_elems._0_16_ = auVar8;
        local_468.data._M_elems._0_16_ = auVar9;
        if ((local_128.fpclass != cpp_dec_float_NaN && local_7a8.fpclass != cpp_dec_float_NaN) &&
           (local_878.data._M_elems._0_16_ = auVar5, local_878.exp = local_728.exp,
           iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_878,&local_128), uVar4 = local_7a8.data._M_elems._0_8_,
           0 < iVar16)) {
          local_168.data._M_elems[8] = local_7a8.data._M_elems[8];
          local_168.data._M_elems[9] = local_7a8.data._M_elems[9];
          local_168.data._M_elems[7]._1_3_ = local_7a8.data._M_elems[7]._1_3_;
          local_168.data._M_elems._24_5_ = local_7a8.data._M_elems._24_5_;
          local_168.data._M_elems[4] = local_7a8.data._M_elems[4];
          local_168.data._M_elems[5] = local_7a8.data._M_elems[5];
          local_168.data._M_elems[0] = local_7a8.data._M_elems[0];
          local_168.data._M_elems[1] = local_7a8.data._M_elems[1];
          local_168.data._M_elems[2] = local_7a8.data._M_elems[2];
          local_168.data._M_elems[3] = local_7a8.data._M_elems[3];
          local_168.exp = local_7a8.exp;
          local_168.neg = local_7a8.neg;
          local_168.fpclass = local_7a8.fpclass;
          local_168.prec_elem = local_7a8.prec_elem;
          pcVar15 = &local_7c0[iVar10].m_backend;
          if (local_7c0[iVar10].m_backend.fpclass != cpp_dec_float_NaN) {
            local_878.fpclass = cpp_dec_float_finite;
            local_878.prec_elem = 10;
            local_878.data._M_elems[0] = 0;
            local_878.data._M_elems[1] = 0;
            local_878.data._M_elems[2] = 0;
            local_878.data._M_elems[3] = 0;
            local_878.data._M_elems[4] = 0;
            local_878.data._M_elems[5] = 0;
            local_878.data._M_elems._24_5_ = 0;
            local_878.data._M_elems[7]._1_3_ = 0;
            local_878.data._M_elems[8] = 0;
            local_878.data._M_elems[9] = 0;
            local_878.exp = 0;
            local_878.neg = false;
            pcVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar14->data)._M_elems;
            local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
            uVar4 = *(undefined8 *)((pcVar14->data)._M_elems + 6);
            local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 8);
            local_878.exp = pcVar14->exp;
            local_878.neg = pcVar14->neg;
            local_878.fpclass = pcVar14->fpclass;
            local_878.prec_elem = pcVar14->prec_elem;
            iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar15,&local_878);
            if (iVar16 == 0) {
              local_768[*local_760] = (int)local_770;
              *local_760 = *local_760 + 1;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (pcVar15,&local_168);
          uVar4 = local_7a8.data._M_elems._0_8_;
          if (pcVar15->fpclass != cpp_dec_float_NaN) {
            local_878.fpclass = cpp_dec_float_finite;
            local_878.prec_elem = 10;
            local_878.data._M_elems[0] = 0;
            local_878.data._M_elems[1] = 0;
            local_878.data._M_elems[2] = 0;
            local_878.data._M_elems[3] = 0;
            local_878.data._M_elems[4] = 0;
            local_878.data._M_elems[5] = 0;
            local_878.data._M_elems._24_5_ = 0;
            local_878.data._M_elems[7]._1_3_ = 0;
            local_878.data._M_elems[8] = 0;
            local_878.data._M_elems[9] = 0;
            local_878.exp = 0;
            local_878.neg = false;
            pcVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar14->data)._M_elems;
            local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
            uVar4 = *(undefined8 *)((pcVar14->data)._M_elems + 6);
            local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 8);
            local_878.exp = pcVar14->exp;
            local_878.neg = pcVar14->neg;
            local_878.fpclass = pcVar14->fpclass;
            local_878.prec_elem = pcVar14->prec_elem;
            iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar15,&local_878);
            uVar4 = local_7a8.data._M_elems._0_8_;
            if (iVar16 == 0) {
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)pcVar15,1e-100);
              uVar4 = local_7a8.data._M_elems._0_8_;
            }
          }
        }
        local_7a8.data._M_elems._0_8_ = uVar4;
        local_878.data._M_elems[8] = local_7f8.data._M_elems[8];
        local_878.data._M_elems[9] = local_7f8.data._M_elems[9];
        local_878.data._M_elems[4] = local_7f8.data._M_elems[4];
        local_878.data._M_elems[5] = local_7f8.data._M_elems[5];
        local_878.data._M_elems._24_5_ = local_7f8.data._M_elems._24_5_;
        local_878.data._M_elems[7]._1_3_ = local_7f8.data._M_elems[7]._1_3_;
        local_878.data._M_elems[0] = local_7f8.data._M_elems[0];
        local_878.data._M_elems[1] = local_7f8.data._M_elems[1];
        uVar4 = local_878.data._M_elems._0_8_;
        local_878.data._M_elems[2] = local_7f8.data._M_elems[2];
        local_878.data._M_elems[3] = local_7f8.data._M_elems[3];
        local_1a8.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
        local_1a8.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
        local_1a8.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
        local_1a8.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
        local_1a8.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
        local_1a8.exp = (eps2->m_backend).exp;
        local_1a8.neg = (eps2->m_backend).neg;
        local_1a8.fpclass = (eps2->m_backend).fpclass;
        local_1a8.prec_elem = (eps2->m_backend).prec_elem;
        local_878.exp = local_7f8.exp;
        local_878.neg = local_7f8.neg;
        local_878.fpclass = local_7f8.fpclass;
        local_878.prec_elem = local_7f8.prec_elem;
        if ((local_7f8.neg == true) &&
           (local_878.data._M_elems[0] = local_7f8.data._M_elems[0],
           local_878.data._M_elems[0] != 0 || local_7f8.fpclass != cpp_dec_float_finite)) {
          local_878.neg = false;
        }
        if ((local_1a8.fpclass != cpp_dec_float_NaN && local_7f8.fpclass != cpp_dec_float_NaN) &&
           (local_878.data._M_elems._0_8_ = uVar4,
           iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_878,&local_1a8), 0 < iVar16)) {
          local_1e8.data._M_elems[8] = local_7f8.data._M_elems[8];
          local_1e8.data._M_elems[9] = local_7f8.data._M_elems[9];
          local_1e8.data._M_elems[7]._1_3_ = local_7f8.data._M_elems[7]._1_3_;
          local_1e8.data._M_elems._24_5_ = local_7f8.data._M_elems._24_5_;
          local_1e8.data._M_elems[4] = local_7f8.data._M_elems[4];
          local_1e8.data._M_elems[5] = local_7f8.data._M_elems[5];
          local_1e8.data._M_elems[0] = local_7f8.data._M_elems[0];
          local_1e8.data._M_elems[1] = local_7f8.data._M_elems[1];
          local_1e8.data._M_elems[2] = local_7f8.data._M_elems[2];
          local_1e8.data._M_elems[3] = local_7f8.data._M_elems[3];
          local_1e8.exp = local_7f8.exp;
          local_1e8.neg = local_7f8.neg;
          local_1e8.fpclass = local_7f8.fpclass;
          local_1e8.prec_elem = local_7f8.prec_elem;
          pcVar15 = &local_7b8[iVar10].m_backend;
          if (local_7b8[iVar10].m_backend.fpclass != cpp_dec_float_NaN) {
            local_878.fpclass = cpp_dec_float_finite;
            local_878.prec_elem = 10;
            local_878.data._M_elems[0] = 0;
            local_878.data._M_elems[1] = 0;
            local_878.data._M_elems[2] = 0;
            local_878.data._M_elems[3] = 0;
            local_878.data._M_elems[4] = 0;
            local_878.data._M_elems[5] = 0;
            local_878.data._M_elems._24_5_ = 0;
            local_878.data._M_elems[7]._1_3_ = 0;
            local_878.data._M_elems[8] = 0;
            local_878.data._M_elems[9] = 0;
            local_878.exp = 0;
            local_878.neg = false;
            pcVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            local_878.data._M_elems._0_8_ = *(undefined8 *)(pcVar14->data)._M_elems;
            local_878.data._M_elems._8_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 2);
            local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
            uVar4 = *(undefined8 *)((pcVar14->data)._M_elems + 6);
            local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 8);
            local_878.exp = pcVar14->exp;
            local_878.neg = pcVar14->neg;
            local_878.fpclass = pcVar14->fpclass;
            local_878.prec_elem = pcVar14->prec_elem;
            iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar15,&local_878);
            if (iVar16 == 0) {
              ridx2[*rn2] = (int)local_770;
              *rn2 = *rn2 + 1;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (pcVar15,&local_1e8);
          if (pcVar15->fpclass != cpp_dec_float_NaN) {
            local_878.fpclass = cpp_dec_float_finite;
            local_878.prec_elem = 10;
            local_878.data._M_elems[0] = 0;
            local_878.data._M_elems[1] = 0;
            local_878.data._M_elems[2] = 0;
            local_878.data._M_elems[3] = 0;
            local_878.data._M_elems[4] = 0;
            local_878.data._M_elems[5] = 0;
            local_878.data._M_elems._24_5_ = 0;
            local_878.data._M_elems[7]._1_3_ = 0;
            local_878.data._M_elems[8] = 0;
            local_878.data._M_elems[9] = 0;
            local_878.exp = 0;
            local_878.neg = false;
            pcVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            local_878.data._M_elems._0_8_ = *(undefined8 *)(pcVar14->data)._M_elems;
            local_878.data._M_elems._8_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 2);
            local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
            uVar4 = *(undefined8 *)((pcVar14->data)._M_elems + 6);
            local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 8);
            local_878.exp = pcVar14->exp;
            local_878.neg = pcVar14->neg;
            local_878.fpclass = pcVar14->fpclass;
            local_878.prec_elem = pcVar14->prec_elem;
            iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar15,&local_878);
            if (iVar16 == 0) {
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)pcVar15,1e-100);
            }
          }
        }
        local_878.data._M_elems[8] = local_838.data._M_elems[8];
        local_878.data._M_elems[9] = local_838.data._M_elems[9];
        local_878.data._M_elems[4] = local_838.data._M_elems[4];
        local_878.data._M_elems[5] = local_838.data._M_elems[5];
        local_878.data._M_elems._24_5_ = local_838.data._M_elems._24_5_;
        local_878.data._M_elems[7]._1_3_ = local_838.data._M_elems[7]._1_3_;
        local_878.data._M_elems[2] = local_838.data._M_elems[2];
        local_878.data._M_elems[3] = local_838.data._M_elems[3];
        local_878.data._M_elems[0] = local_838.data._M_elems[0];
        local_878.data._M_elems[1] = local_838.data._M_elems[1];
        auVar5 = (undefined1  [16])local_878.data._M_elems._0_16_;
        local_228.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
        local_228.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
        local_228.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
        local_228.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
        local_228.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
        local_228.exp = (eps3->m_backend).exp;
        local_228.neg = (eps3->m_backend).neg;
        local_228.fpclass = (eps3->m_backend).fpclass;
        local_228.prec_elem = (eps3->m_backend).prec_elem;
        local_878.exp = local_838.exp;
        local_878.neg = local_838.neg;
        local_878.fpclass = local_838.fpclass;
        local_878.prec_elem = local_838.prec_elem;
        if ((local_838.neg == true) &&
           (local_878.data._M_elems[0] = local_838.data._M_elems[0],
           local_878.data._M_elems[0] != 0 || local_838.fpclass != cpp_dec_float_finite)) {
          local_878.neg = false;
        }
        if ((local_228.fpclass != cpp_dec_float_NaN && local_838.fpclass != cpp_dec_float_NaN) &&
           (local_878.data._M_elems._0_16_ = auVar5,
           iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_878,&local_228), 0 < iVar16)) {
          local_268.data._M_elems[8] = local_838.data._M_elems[8];
          local_268.data._M_elems[9] = local_838.data._M_elems[9];
          local_268.data._M_elems[7]._1_3_ = local_838.data._M_elems[7]._1_3_;
          local_268.data._M_elems._24_5_ = local_838.data._M_elems._24_5_;
          local_268.data._M_elems[4] = local_838.data._M_elems[4];
          local_268.data._M_elems[5] = local_838.data._M_elems[5];
          local_268.data._M_elems[0] = local_838.data._M_elems[0];
          local_268.data._M_elems[1] = local_838.data._M_elems[1];
          local_268.data._M_elems[2] = local_838.data._M_elems[2];
          local_268.data._M_elems[3] = local_838.data._M_elems[3];
          local_268.exp = local_838.exp;
          local_268.neg = local_838.neg;
          local_268.fpclass = local_838.fpclass;
          local_268.prec_elem = local_838.prec_elem;
          pcVar15 = &vec3[iVar10].m_backend;
          if (vec3[iVar10].m_backend.fpclass != cpp_dec_float_NaN) {
            local_878.fpclass = cpp_dec_float_finite;
            local_878.prec_elem = 10;
            local_878.data._M_elems[0] = 0;
            local_878.data._M_elems[1] = 0;
            local_878.data._M_elems[2] = 0;
            local_878.data._M_elems[3] = 0;
            local_878.data._M_elems[4] = 0;
            local_878.data._M_elems[5] = 0;
            local_878.data._M_elems._24_5_ = 0;
            local_878.data._M_elems[7]._1_3_ = 0;
            local_878.data._M_elems[8] = 0;
            local_878.data._M_elems[9] = 0;
            local_878.exp = 0;
            local_878.neg = false;
            pcVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar14->data)._M_elems;
            local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
            uVar4 = *(undefined8 *)((pcVar14->data)._M_elems + 6);
            local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 8);
            local_878.exp = pcVar14->exp;
            local_878.neg = pcVar14->neg;
            local_878.fpclass = pcVar14->fpclass;
            local_878.prec_elem = pcVar14->prec_elem;
            iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar15,&local_878);
            if (iVar10 == 0) {
              ridx3[*rn3] = (int)local_770;
              *rn3 = *rn3 + 1;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (pcVar15,&local_268);
          if (pcVar15->fpclass != cpp_dec_float_NaN) {
            local_878.fpclass = cpp_dec_float_finite;
            local_878.prec_elem = 10;
            local_878.data._M_elems[0] = 0;
            local_878.data._M_elems[1] = 0;
            local_878.data._M_elems[2] = 0;
            local_878.data._M_elems[3] = 0;
            local_878.data._M_elems[4] = 0;
            local_878.data._M_elems[5] = 0;
            local_878.data._M_elems._24_5_ = 0;
            local_878.data._M_elems[7]._1_3_ = 0;
            local_878.data._M_elems[8] = 0;
            local_878.data._M_elems[9] = 0;
            local_878.exp = 0;
            local_878.neg = false;
            pcVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            local_878.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar14->data)._M_elems;
            local_878.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
            uVar4 = *(undefined8 *)((pcVar14->data)._M_elems + 6);
            local_878.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_878.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_878.data._M_elems._32_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 8);
            local_878.exp = pcVar14->exp;
            local_878.neg = pcVar14->neg;
            local_878.fpclass = pcVar14->fpclass;
            local_878.prec_elem = pcVar14->prec_elem;
            iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar15,&local_878);
            if (iVar10 == 0) {
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)pcVar15,1e-100);
            }
          }
        }
        local_840 = uVar17 + 1;
      } while (local_840 != local_740);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright3(
   R* vec, int* ridx, int& rn, R eps,
   R* vec2, int* ridx2, int& rn2, R eps2,
   R* vec3, int* ridx3, int& rn3, R eps3)
{
   int i, j, k, n;
   int end;
   R x, x2, x3;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = 0; i < end; ++i)
   {
      j = lrow[i];
      x = vec[j];
      x2 = vec2[j];
      x3 = vec3[j];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         if(isNotZero(x2, eps2))
         {
            if(isNotZero(x3, eps3))
            {
               // case 1: all three vectors are nonzero at j
               for(j = lbeg[i + 1]; j > k; --j)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  n = *idx++;
                  updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
                  updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
                  updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
                  ++val;
               }
            }
            else
            {
               // case 2: 1 and 2 are nonzero at j
               for(j = lbeg[i + 1]; j > k; --j)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  n = *idx++;
                  updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
                  updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
                  ++val;
               }
            }
         }
         else if(isNotZero(x3, eps3))
         {
            // case 3: 1 and 3 are nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
               ++val;
            }
         }
         else
         {
            // case 4: only 1 is nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               ++val;
            }
         }
      }
      else if(isNotZero(x2, eps2))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         if(isNotZero(x3, eps3))
         {
            // case 5: 2 and 3 are nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
               ++val;
            }
         }
         else
         {
            // case 6: only 2 is nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               ++val;
            }
         }
      }
      else if(isNotZero(x3, eps3))
      {
         // case 7: only 3 is nonzero at j
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
            ++val;
         }
      }
   }

   if(l.updateType)                      /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp1, tmp2, tmp3;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp1 += vec[*idx] * (*val);
            tmp2 += vec2[*idx] * (*val);
            tmp3 += vec3[*idx++] * (*val++);
         }

         x = R(tmp1);
         x2 = R(tmp2);
         x3 = R(tmp3);

         j = lrow[i];

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);

         if(isNotZero(x2, eps2))
            updateSolutionVectorLright(x2, j, vec2[j], ridx2, rn2);

         if(isNotZero(x3, eps3))
            updateSolutionVectorLright(x3, j, vec3[j], ridx3, rn3);
      }
   }
}